

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall ON_Viewport::SetFrustumNearFar(ON_Viewport *this,double *center,double radius)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (center != (double *)0x0) {
    bVar9 = ON_IsValid(*center);
    if (bVar9) {
      bVar9 = ON_IsValid(center[1]);
      if (bVar9) {
        bVar9 = ON_IsValid(center[2]);
        if (bVar9) {
          bVar9 = ON_IsValid(radius);
          if ((bVar9) && (this->m_bValidCamera == true)) {
            dVar12 = (this->m_CamZ).z;
            dVar1 = (this->m_CamZ).y;
            dVar2 = (this->m_CamZ).x;
            dVar3 = (this->m_CamLoc).z;
            dVar4 = (this->m_CamLoc).x;
            dVar5 = (this->m_CamLoc).y;
            dVar6 = *center;
            dVar7 = center[1];
            dVar8 = center[2];
            dVar11 = (double)((ulong)radius | 0x8000000000000000) * dVar2;
            dVar11 = (dVar3 - (dVar11 + dVar8)) * dVar12 +
                     (dVar4 - (dVar11 + dVar6)) * dVar2 + (dVar5 - (dVar11 + dVar7)) * dVar1;
            bVar9 = ON_IsValid(dVar11);
            if (bVar9) {
              dVar13 = ABS(radius) * dVar2;
              dVar12 = (dVar3 - (dVar13 + dVar8)) * dVar12 +
                       (dVar4 - (dVar6 + dVar13)) * dVar2 + dVar1 * (dVar5 - (dVar7 + dVar13));
              bVar9 = ON_IsValid(dVar12);
              if ((0.0 < dVar11) && (bVar9)) {
                dVar12 = dVar12 * 0.9375;
                dVar11 = dVar11 * 1.0625;
                uVar10 = -(ulong)(0.0 < dVar12);
                dVar12 = (double)(uVar10 & (ulong)dVar12 |
                                 ~uVar10 & (ulong)(dVar11 * this->m__MIN_NEAR_OVER_FAR));
                if (this->m_projection == perspective_view) {
                  bVar9 = SetFrustumNearFar(this,dVar12,dVar11,this->m__MIN_NEAR_DIST,
                                            this->m__MIN_NEAR_OVER_FAR,(dVar12 + dVar11) * 0.5,0.0);
                  return bVar9;
                }
                bVar9 = SetFrustumNearFar(this,dVar12,dVar11);
                return bVar9;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Viewport::SetFrustumNearFar( 
       const double* center,
       double        radius
       )
{
  bool rc = false;
  double n, f, d;
  double camLoc[3], camZ[3], P[3];

  if ( !center 
       || !ON_IsValid(center[0]) 
       || !ON_IsValid(center[1]) 
       || !ON_IsValid(center[2])
       || !ON_IsValid(radius)
     )
  {
    return false;
  }

  if ( GetCameraFrame( camLoc, nullptr, nullptr, camZ ) ) 
  {
    d = fabs(radius);
    P[0] = center[0] + d*camZ[0];
    P[1] = center[1] + d*camZ[0];
    P[2] = center[2] + d*camZ[0];
    n = clipDist(camLoc,camZ,P);
    P[0] = center[0] - d*camZ[0];
    P[1] = center[1] - d*camZ[0];
    P[2] = center[2] - d*camZ[0];
    f = clipDist(camLoc,camZ,P);
    if ( !ON_IsValid(f) || !ON_IsValid(n) )
      return false;
    if ( f <= 0.0 )
      return false; // sphere is behind camera
    n *= 0.9375;
    f *= 1.0625;
    if ( n <= 0.0 )
      n = m__MIN_NEAR_OVER_FAR*f;
    if ( IsPerspectiveProjection() )
      rc = SetFrustumNearFar( n, f, m__MIN_NEAR_DIST, m__MIN_NEAR_OVER_FAR, 0.5*(n+f) );
    else
      rc = SetFrustumNearFar( n, f );
  }
  return rc;
}